

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNavWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *in_RDI;
  ImGuiContext *g;
  char *local_18;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    if ((GImGui->DebugLogFlags & 2U) != 0) {
      if (in_RDI == (ImGuiWindow *)0x0) {
        local_18 = "<NULL>";
      }
      else {
        local_18 = in_RDI->Name;
      }
      DebugLog("[focus] SetNavWindow(\"%s\")\n",local_18);
    }
    pIVar1->NavWindow = in_RDI;
    pIVar1->NavLastValidSelectionUserData = -1;
  }
  pIVar1->NavMoveScoringItems = false;
  pIVar1->NavMoveSubmitted = false;
  pIVar1->NavInitRequest = false;
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::SetNavWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] SetNavWindow(\"%s\")\n", window ? window->Name : "<NULL>");
        g.NavWindow = window;
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
    }
    g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
    NavUpdateAnyRequestFlag();
}